

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepScanLineInputFile::rawPixelData
          (DeepScanLineInputFile *this,int firstScanLine,char *pixelData,Int64 *pixelDataSize)

{
  Data *pDVar1;
  unsigned_long uVar2;
  pthread_mutex_t *__mutex;
  IStream *pIVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  InputExc *pIVar8;
  ostream *poVar9;
  ArgExc *this_00;
  ulong uVar10;
  Int64 packedDataSize;
  Int64 sampleCountTableSize;
  int local_1c0;
  undefined4 uStack_1bc;
  undefined8 local_1b8;
  ostream local_1a8 [376];
  
  iVar5 = lineBufferMinY(firstScanLine,this->_data->minY,this->_data->linesInBuffer);
  pDVar1 = this->_data;
  iVar6 = (iVar5 - pDVar1->minY) / pDVar1->linesInBuffer;
  uVar2 = (pDVar1->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar6];
  if (uVar2 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Scan line ",10);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," is missing.",0xc);
    pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar8,(stringstream *)&local_1b8);
    __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  __mutex = (pthread_mutex_t *)pDVar1->_streamData;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  iVar7 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  if (CONCAT44(extraout_var,iVar7) !=
      (this->_data->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar6]) {
    pIVar3 = this->_data->_streamData->is;
    (*pIVar3->_vptr_IStream[6])(pIVar3,uVar2);
  }
  if ((this->_data->version & 0x1000) != 0) {
    pIVar3 = this->_data->_streamData->is;
    (*pIVar3->_vptr_IStream[3])(pIVar3,&local_1b8,4);
    if ((int)local_1b8 != this->_data->partNumber) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unexpected part number ",0x17);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", should be ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,this->_data->partNumber);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&local_1b8);
      __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  pIVar3 = this->_data->_streamData->is;
  (*pIVar3->_vptr_IStream[3])(pIVar3,&local_1b8,4);
  iVar6 = (int)local_1b8;
  if ((int)local_1b8 == iVar5) {
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(this->_data->_streamData->is,&local_1b8);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              (this->_data->_streamData->is,(unsigned_long *)&local_1c0);
    uVar10 = CONCAT44(local_1b8._4_4_,(int)local_1b8) + CONCAT44(uStack_1bc,local_1c0) + 0x1c;
    uVar4 = *pixelDataSize;
    *pixelDataSize = uVar10;
    if ((pixelData != (char *)0x0) && (uVar10 <= uVar4)) {
      *(int *)pixelData = iVar6;
      *(long *)(pixelData + 4) = CONCAT44(local_1b8._4_4_,(int)local_1b8);
      *(long *)(pixelData + 0xc) = CONCAT44(uStack_1bc,local_1c0);
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                (this->_data->_streamData->is,(unsigned_long *)(pixelData + 0x14));
      pIVar3 = this->_data->_streamData->is;
      (*pIVar3->_vptr_IStream[3])(pIVar3,pixelData + 0x1c,(ulong)(uint)(local_1c0 + (int)local_1b8))
      ;
    }
    pDVar1 = this->_data;
    if (((pDVar1->version & 0x1000) == 0) && (pDVar1->nextLineBufferMinY == iVar5)) {
      pIVar3 = pDVar1->_streamData->is;
      (*pIVar3->_vptr_IStream[6])(pIVar3,uVar2);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar8,"Unexpected data block y coordinate.");
  __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
DeepScanLineInputFile::rawPixelData (int firstScanLine,
                                     char *pixelData,
                                     Int64 &pixelDataSize)
{
   
    
    int minY = lineBufferMinY
    (firstScanLine, _data->minY, _data->linesInBuffer);
    int lineBufferNumber = (minY - _data->minY) / _data->linesInBuffer;
    
    Int64 lineOffset = _data->lineOffsets[lineBufferNumber];
    
    if (lineOffset == 0)
        THROW (IEX_NAMESPACE::InputExc, "Scan line " << minY << " is missing.");
    
    
    // enter the lock here - prevent another thread reseeking the file during read
    Lock lock (*_data->_streamData);
    
    //
    // Seek to the start of the scan line in the file,
    //
    
    if (_data->_streamData->is->tellg() != _data->lineOffsets[lineBufferNumber])
        _data->_streamData->is->seekg (lineOffset);
    
    //
    // Read the data block's header.
    //
    
    int yInFile;
    
    //
    // Read the part number when we are dealing with a multi-part file.
    //
    
    if (isMultiPart(_data->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, partNumber);
        if (partNumber != _data->partNumber)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Unexpected part number " << partNumber
            << ", should be " << _data->partNumber << ".");
        }
    }
    
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, yInFile);
    
    if (yInFile != minY)
        throw IEX_NAMESPACE::InputExc ("Unexpected data block y coordinate.");
    
    Int64 sampleCountTableSize;
    Int64 packedDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, sampleCountTableSize);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, packedDataSize);
    
    // total requirement for reading all the data
    
    Int64 totalSizeRequired=28+sampleCountTableSize+packedDataSize;
    
    bool big_enough = totalSizeRequired<=pixelDataSize;
    
    pixelDataSize = totalSizeRequired;
    
    // was the block we were given big enough?
    if(!big_enough || pixelData==NULL)
    {        
        // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
        // in single part files)
        if(!isMultiPart(_data->version))
        {
          if (_data->nextLineBufferMinY == minY)
              _data->_streamData->is->seekg (lineOffset);
        }
        // leave lock here - bail before reading more data
        return;
    }
    
    // copy the values we have read into the output block
    *(int *) pixelData = yInFile;
    *(Int64 *) (pixelData+4) =sampleCountTableSize;
    *(Int64 *) (pixelData+12) = packedDataSize;
    
    // didn't read the unpackedsize - do that now
    Xdr::read<StreamIO> (*_data->_streamData->is, *(Int64 *) (pixelData+20));
    
    // read the actual data
    _data->_streamData->is->read(pixelData+28, sampleCountTableSize+packedDataSize);
    
    // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
    // in single part files)
    if(!isMultiPart(_data->version))
    {
        if (_data->nextLineBufferMinY == minY)
            _data->_streamData->is->seekg (lineOffset);
    }
    
    // leave lock here
    
}